

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

natwm_error map_insert(map *map,void *key,void *value)

{
  uint32_t uVar1;
  natwm_error nVar2;
  size_t sVar3;
  map_entry *entry;
  
  if (key == (void *)0x0) {
    nVar2 = GENERIC_ERROR;
  }
  else {
    sVar3 = (*map->key_size_function)(key);
    uVar1 = (*map->hash_function)(key,sVar3);
    entry = (map_entry *)malloc(0x18);
    if (entry != (map_entry *)0x0) {
      entry->hash = uVar1;
      entry->key = key;
      entry->value = value;
      nVar2 = map_insert_entry(map,entry);
      return nVar2;
    }
    nVar2 = MEMORY_ALLOCATION_ERROR;
  }
  return nVar2;
}

Assistant:

enum natwm_error map_insert(struct map *map, const void *key, void *value)
{
        if (key == NULL) {
                return GENERIC_ERROR;
        }

        struct map_entry *entry = NULL;
        size_t key_size = map->key_size_function(key);
        uint32_t hash = map->hash_function(key, key_size);
        enum natwm_error error = entry_init(hash, key, value, &entry);

        if (error != NO_ERROR) {
                return error;
        }

        return map_insert_entry(map, entry);
}